

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O2

int run_test_udp_open_bound(void)

{
  int iVar1;
  uv_os_sock_t __fd;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_udp_t client;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  client.data = (void *)(long)iVar1;
  if (client.data == (void *)0x0) {
    __fd = create_udp_socket();
    iVar1 = bind(__fd,(sockaddr *)&addr,0x10);
    client.data = (void *)(long)iVar1;
    if (client.data == (void *)0x0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_udp_init(uVar2,&client);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b == (void *)0x0) {
        iVar1 = uv_udp_open(&client,__fd);
        eval_b = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b == (void *)0x0) {
          iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
          eval_b = (int64_t)iVar1;
          eval_b_2 = 0;
          if ((void *)eval_b == (void *)0x0) {
            uv_close(&client,0);
            uVar2 = uv_default_loop();
            uv_run(uVar2,0);
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            eval_b = 0;
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            eval_b_2 = (int64_t)iVar1;
            if (eval_b_2 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(uv_default_loop())";
            pcVar3 = "0";
            uVar2 = 0xf8;
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar2 = 0xf3;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0xf0;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0xed;
      }
      goto LAB_001aaa03;
    }
    pcVar3 = "r";
    uVar2 = 0xea;
  }
  else {
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0xe4;
  }
  pcVar4 = "0";
  eval_b_2 = 0;
  eval_b = (int64_t)client.data;
LAB_001aaa03:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(udp_open_bound) {
  struct sockaddr_in addr;
  uv_udp_t client;
  uv_os_sock_t sock;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = bind(sock, (struct sockaddr*) &addr, sizeof(addr));
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}